

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringStream.c
# Opt level: O2

void sysbvm_stringStream_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringStreamType,"nextPut:",2,4,(void *)0x0,
             sysbvm_stringStream_primitive_nextPut);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringStreamType,"nextPutAll:",2,4,(void *)0x0,
             sysbvm_stringStream_primitive_nextPutAll);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringStreamType,"nextPutAllBytesOf:",2,4,(void *)0x0,
             sysbvm_stringStream_primitive_nextPutAll);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringStreamType,"asByteArray",1,0x1c,(void *)0x0,
             sysbvm_stringStream_primitive_asByteArray);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringStreamType,"asString",1,0x1c,(void *)0x0,
             sysbvm_stringStream_primitive_asString);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringStreamType,"asSymbol",1,0x1c,(void *)0x0,
             sysbvm_stringStream_primitive_asSymbol);
  return;
}

Assistant:

void sysbvm_stringStream_setupPrimitives(sysbvm_context_t *context)
{
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringStreamType, "nextPut:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_stringStream_primitive_nextPut);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringStreamType, "nextPutAll:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_stringStream_primitive_nextPutAll);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringStreamType, "nextPutAllBytesOf:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE, NULL, sysbvm_stringStream_primitive_nextPutAll);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringStreamType, "asByteArray", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_stringStream_primitive_asByteArray);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringStreamType, "asString", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_stringStream_primitive_asString);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringStreamType, "asSymbol", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_stringStream_primitive_asSymbol);
}